

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_filter.cpp
# Opt level: O3

void anon_unknown.dwarf_5929e::SequenceTester<QList<int>_>::exec(void)

{
  QSharedData *pQVar1;
  QArrayData *pQVar2;
  bool bVar3;
  PromiseData<QList<int>_> *this;
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *this_00;
  QSharedData *pQVar4;
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *this_01;
  QSharedData *pQVar5;
  PromiseData<QList<int>_> *pPVar6;
  const_iterator expectedBegin;
  QPromiseReject<QList<int>_> *reject;
  QSharedData *pQVar7;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> QVar8;
  PromiseResolver<QList<int>_> resolver_3;
  undefined1 local_188 [16];
  _Manager_type local_178;
  _Invoker_type p_Stack_170;
  PromiseResolver<QList<int>_> resolver_2;
  undefined1 local_158;
  undefined7 uStack_157;
  QArrayData *d;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> local_148;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_140;
  PromiseResolver<QList<int>_> resolver_1;
  QPromise<QList<int>_> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_108;
  PromiseResolver<QList<int>_> resolver;
  _Manager_type local_f0;
  _Any_data local_b8;
  code *local_a8;
  QList<int> local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  code *local_40;
  
  reject = (QPromiseReject<QList<int>_> *)0x1;
  local_98.d.ptr = (int *)QArrayData::allocate((QArrayData **)&local_98,4,8,10,KeepSize);
  local_98.d.ptr[0] = 0x2a;
  local_98.d.ptr[1] = 0x2b;
  local_98.d.ptr[2] = 0x2c;
  local_98.d.ptr[3] = 0x2d;
  local_98.d.ptr[4] = 0x2e;
  local_98.d.ptr[5] = 0x2f;
  local_98.d.ptr[6] = 0x30;
  local_98.d.ptr[7] = 0x31;
  local_98.d.ptr[8] = 0x32;
  local_98.d.ptr[9] = 0x33;
  local_98.d.size = 10;
  this = (PromiseData<QList<int>_> *)operator_new(0x68);
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&(this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = 0
  ;
  (this->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0014c538;
  QReadWriteLock::QReadWriteLock
            (&(this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0014c4c0;
  (this->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar7 = &(this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar7 = &(this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar7 = &(this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
  local_188._0_8_ = &PTR__QPromiseBase_0014c488;
  local_188._8_8_ = this;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver,(QPromise<QList<int>_> *)local_188);
  local_188._0_8_ = &PTR__QPromiseBase_0014c458;
  if ((PromiseData<QList<int>_> *)local_188._8_8_ != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar4 = (QSharedData *)(local_188._8_8_ + 8);
    (pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<QList<int>_> *)local_188._8_8_ != (PromiseData<QList<int>_> *)0x0)) {
      (**(code **)(*(long *)local_188._8_8_ + 8))();
    }
  }
  if (resolver.m_d.d == (Data *)0x0) {
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
         (Data *)0x0;
LAB_0010d576:
    bVar3 = true;
    QVar8.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    resolver_1 = resolver;
    if (resolver.m_d.d == (Data *)0x0) goto LAB_0010d576;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar3 = false;
    QVar8 = resolver.m_d.d;
  }
  QtPromisePrivate::PromiseResolver<QList<int>>::resolve<QList<int>>
            ((PromiseResolver<QList<int>> *)&resolver_1,&local_98);
  if (!bVar3) {
    LOCK();
    ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar8.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  this_00 = (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)operator_new(0x68);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014c538;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014c4c0;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar4 = &this_00->super_QSharedData;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       &PTR__QPromiseBase_0014c488;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver_1,(QPromise<QList<int>_> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       &PTR__QPromiseBase_0014c458;
  if (this_00 != (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)0x0) {
    LOCK();
    pQVar5 = &this_00->super_QSharedData;
    (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (this_00 != (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)0x0)) {
      (*this_00->_vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_b8._M_unused._M_object = (Data *)0x0;
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
         (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_b8._M_unused._M_object = (void *)resolver_1.m_d.d;
    if (resolver_1.m_d.d == (Data *)0x0) {
      resolver_2.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           (Data *)0x0;
LAB_0010d726:
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      if (resolver_2.m_d.d == (Data *)0x0) goto LAB_0010d73b;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      resolver_2 = resolver_1;
      if (resolver_1.m_d.d != (Data *)0x0) goto LAB_0010d726;
    }
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
LAB_0010d73b:
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_188._0_8_ = local_b8._M_unused._0_8_;
  local_188._8_8_ = resolver_2.m_d.d;
  local_78._M_unused._M_object = operator_new(0x18);
  *(undefined8 *)local_78._M_unused._0_8_ = local_188._0_8_;
  if ((Data *)local_188._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_188._0_8_ = *(int *)local_188._0_8_ + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_188._8_8_;
  if ((PromiseData<QList<int>_> *)local_188._8_8_ == (PromiseData<QList<int>_> *)0x0) {
    *(code *)((long)local_78._M_unused._0_8_ + 0x10) = local_178._0_1_;
    pcStack_60 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_188._8_8_ = *(int *)local_188._8_8_ + 1;
    UNLOCK();
    *(code *)((long)local_78._M_unused._0_8_ + 0x10) = local_178._0_1_;
    pcStack_60 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    if ((PromiseData<QList<int>_> *)local_188._8_8_ != (PromiseData<QList<int>_> *)0x0) {
      LOCK();
      *(int *)local_188._8_8_ = *(int *)local_188._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_188._8_8_ == 0) {
        operator_delete((void *)local_188._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_188._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_188._0_8_ = *(int *)local_188._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_188._0_8_ == 0) {
      operator_delete((void *)local_188._0_8_,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this,
             (function<void_(const_QList<int>_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_b8,
             (QPromiseResolve<QList<int>_> *)&resolver_2,reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  if ((Data *)local_b8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_b8._M_unused._0_8_ = *local_b8._M_unused._M_object + -1;
    UNLOCK();
    if (*local_b8._M_unused._M_object == 0) {
      operator_delete(local_b8._M_unused._M_object,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar3 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this);
  }
  this_01 = (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)operator_new(0x68);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014c538;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014c4c0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar5 = &this_01->super_QSharedData;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       &PTR__QPromiseBase_0014c488;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver_2,(QPromise<QList<int>_> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       &PTR__QPromiseBase_0014c458;
  if (this_01 != (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)0x0) {
    LOCK();
    pQVar1 = &this_01->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (this_01 != (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)0x0)) {
      (*this_01->_vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_2.m_d.d == (Data *)0x0) {
    d = (QArrayData *)0x0;
    local_188._8_8_ = (PromiseData<QList<int>_> *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    d = (QArrayData *)resolver_2.m_d.d;
    if (resolver_2.m_d.d == (Data *)0x0) {
      resolver_3.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           (Data *)0x0;
LAB_0010da34:
      LOCK();
      *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
      UNLOCK();
      local_188._8_8_ = resolver_3.m_d.d;
      if (resolver_3.m_d.d == (Data *)0x0) goto LAB_0010da49;
    }
    else {
      LOCK();
      *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
      UNLOCK();
      resolver_3 = resolver_2;
      if (resolver_2.m_d.d != (Data *)0x0) goto LAB_0010da34;
    }
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    local_188._8_8_ = resolver_3.m_d.d;
  }
LAB_0010da49:
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       (Data *)0x0;
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       local_188._8_8_;
  local_188._0_8_ = d;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       operator_new(0x18);
  *(undefined8 *)resolver_1.m_d.d = local_188._0_8_;
  if ((QArrayData *)local_188._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_188._0_8_ = *(int *)local_188._0_8_ + 1;
    UNLOCK();
  }
  ((Data *)resolver_1.m_d.d)->promise = (QPromise<QList<int>_> *)local_188._8_8_;
  if ((PromiseData<QList<int>_> *)local_188._8_8_ == (PromiseData<QList<int>_> *)0x0) {
    *(code *)&(((Data *)((long)resolver_1.m_d.d + 0x10))->super_QSharedData).ref.
              super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i = local_178._0_1_;
  }
  else {
    LOCK();
    *(int *)local_188._8_8_ = *(int *)local_188._8_8_ + 1;
    UNLOCK();
    *(code *)&(((Data *)((long)resolver_1.m_d.d + 0x10))->super_QSharedData).ref.
              super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i = local_178._0_1_;
    if ((PromiseData<QList<int>_> *)local_188._8_8_ != (PromiseData<QList<int>_> *)0x0) {
      LOCK();
      *(int *)local_188._8_8_ = *(int *)local_188._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_188._8_8_ == 0) {
        operator_delete((void *)local_188._8_8_,0x10);
      }
    }
  }
  if ((QArrayData *)local_188._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_188._0_8_ = *(int *)local_188._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_188._0_8_ == 0) {
      operator_delete((void *)local_188._0_8_,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (this_00,(function<void_(const_QList<int>_&)> *)&resolver_1);
  std::
  _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
  ::_M_manager((_Any_data *)&resolver_1,(_Any_data *)&resolver_1,__destroy_functor);
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_b8,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&d,
             (QPromiseResolve<QList<int>_> *)&resolver_3,reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_3.m_d.d == 0) {
      operator_delete((void *)resolver_3.m_d.d,0x10);
    }
  }
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  bVar3 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (this_00);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch(this_00);
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014c458;
  pPVar6 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled =
       0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0014c538;
  QReadWriteLock::QReadWriteLock
            (&(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0014c4c0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData
  ;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  d = (QArrayData *)&PTR__QPromiseBase_0014c488;
  local_148.d = pPVar6;
  p.super_QPromiseBase<QList<int>_>.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver_3,(QPromise<QList<int>_> *)&d);
  d = (QArrayData *)&PTR__QPromiseBase_0014c458;
  if (local_148.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_148.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_148.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((local_148.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_3.m_d.d == (Data *)0x0) {
    local_108.d = (Data *)0x0;
    local_140.d = (Data *)0x0;
    goto LAB_0010dd3a;
  }
  LOCK();
  *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
  UNLOCK();
  local_108 = resolver_3.m_d.d;
  if (resolver_3.m_d.d == (Data *)0x0) {
    local_140.d = (Data *)0x0;
LAB_0010dd25:
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    if (local_140.d == (Data *)0x0) goto LAB_0010dd3a;
  }
  else {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    local_140 = resolver_3.m_d.d;
    if (resolver_3.m_d.d != (Data *)0x0) goto LAB_0010dd25;
  }
  LOCK();
  ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
LAB_0010dd3a:
  QVar8.d = local_140.d;
  local_178 = (_Manager_type)0x0;
  p_Stack_170 = (_Invoker_type)0x0;
  local_188._0_8_ = (_func_int **)0x0;
  local_188._8_8_ = (PromiseData<QList<int>_> *)0x0;
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       local_108.d;
  local_188._0_8_ = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
  local_188._0_8_)->d = (Data *)resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
  (local_188._0_8_ + 8))->d = QVar8.d;
  if (QVar8.d == (Data *)0x0) {
    *(undefined1 *)
     &((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
      (local_188._0_8_ + 0x10))->d = local_158;
    p_Stack_170 = std::
                  _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_invoke;
    local_178 = std::
                _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(undefined1 *)
     &((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
      (local_188._0_8_ + 0x10))->d = local_158;
    p_Stack_170 = std::
                  _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_invoke;
    local_178 = std::
                _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_manager;
    if (QVar8.d != (Data *)0x0) {
      LOCK();
      ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QVar8.d,0x10);
      }
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (this_01,(function<void_(const_QList<int>_&)> *)local_188);
  if (local_178 != (_Manager_type)0x0) {
    (*local_178)((_Any_data *)local_188,(_Any_data *)local_188,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_108,
             (QPromiseResolve<QList<int>_> *)&local_140,reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (this_01,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  if (local_f0 != (_Manager_type)0x0) {
    (*local_f0)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  }
  if (local_140.d != (Data *)0x0) {
    LOCK();
    ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_140.d,0x10);
    }
  }
  if (local_108.d != (Data *)0x0) {
    LOCK();
    ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_108.d,0x10);
    }
  }
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_3.m_d.d == 0) {
      operator_delete((void *)resolver_3.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014c488;
  bVar3 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (this_01);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch(this_01);
  }
  LOCK();
  (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])
              (this);
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,8);
    }
  }
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (int *)0x0;
  local_98.d.size = 0;
  waitForValue<QList<int>>((QList<int> *)&resolver_2,&p,&local_98);
  expectedBegin.i = (int *)QArrayData::allocate(&d,4,8,3,KeepSize);
  pQVar2 = d;
  expectedBegin.i[0] = 0x2b;
  expectedBegin.i[1] = 0x2f;
  expectedBegin.i[2] = 0x31;
  QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
            ((const_iterator)QVar8.d,
             (const_iterator)(&(QVar8.d)->super_QSharedData + CONCAT71(uStack_157,local_158)),
             expectedBegin,(const_iterator)(expectedBegin.i + 3),"waitForValue(p, Sequence{})",
             "(Sequence{43, 47, 49})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_filter.cpp"
             ,0x33);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,4,8);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      QArrayData::deallocate((QArrayData *)resolver_2.m_d.d,4,8);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,8);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014c458;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar7 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_filter::preserveOrder()
{
    auto p =
        QtPromise::QPromise<QVector<int>>::resolve({250, 50, 100, 400, 300}).filter([](int v, ...) {
            return QtPromise::QPromise<bool>::resolve(v > 200).delay(v);
        });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{250, 400, 300}));
}